

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigfile.c
# Opt level: O0

int big_block_get_attr(BigBlock *block,char *attrname,void *data,char *dtype,int nmemb)

{
  int iVar1;
  int nmemb_local;
  char *dtype_local;
  void *data_local;
  char *attrname_local;
  BigBlock *block_local;
  
  iVar1 = attrset_get_attr(block->attrset,attrname,data,dtype,nmemb);
  return iVar1;
}

Assistant:

int
big_block_get_attr(BigBlock * block, const char * attrname, void * data, const char * dtype, int nmemb)
{
    return attrset_get_attr(block->attrset, attrname, data, dtype, nmemb);
}